

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int sas_client_session_state_machine
              (sas_client *client,sas_transport_packet_header *header,size_t count)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  rxc_sink_logic *prVar4;
  int iVar5;
  rxc_source *prVar6;
  rxc_pipeline *prVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  sas_transport_packet_header sStack_28;
  
  uVar9 = header->seq;
  uVar10 = (client->session).ack;
  if (uVar9 < uVar10) {
    sas_log("[DEBUG] Dropping packet\n");
    return 0;
  }
  if (uVar10 < uVar9) {
    sas_log("[DEBUG] Out-of-order packet\n");
    uVar9 = header->seq;
  }
  (client->session).send_window = header->window;
  uVar3 = header->length;
  uVar10 = 1;
  if (1 < uVar3) {
    uVar10 = (uint)uVar3;
  }
  (client->session).ack = uVar10 + uVar9;
  bVar1 = header->flags;
  if ((bVar1 & 4) == 0) {
    uVar2 = (client->session).state;
    if (uVar2 == '\x04') {
      (client->session).chunk.size = (ulong)uVar3 - 8;
      (client->session).chunk.buffer = (uint8_t *)(header + 1);
      prVar4 = (client->session).sink_logic;
      (*prVar4->on_push)(prVar4,&(client->session).chunk);
      (client->session).receive_window = 0;
      sStack_28.flags = '\b';
      sStack_28.length = 0;
      sas_client_session_send(client,&sStack_28);
      return 0;
    }
    if (uVar2 != '\x02') {
      sas_log("[WARN] Unexpected state %d in state machine\n");
      return 0;
    }
    sas_transport_packet_cfg_ack_decode((sas_transport_packet_cfg_ack *)(header + 1));
    (client->session).chunk.dealloc = chunk_dealloc;
    (client->session).chunk.sample_rate = header[1].seq;
    (client->session).chunk.sample_size = (int8_t)header[1].ack;
    (client->session).chunk.channels = *(int8_t *)((long)&header[1].ack + 1);
    (client->session).chunk.codec = *(uint8_t *)((long)&header[1].ack + 2);
    (client->session).chunk.size = (ulong)header->length - 8;
    (client->session).chunk.buffer = header[1].reserved;
    sas_log("[INFO] %d %d %d\n");
    prVar6 = sas_client_session_source(client);
    prVar7 = (rxc_pipeline *)rxc_source_to(prVar6,client->sink);
    (client->session).pipeline = prVar7;
    uVar8 = rxc_scheduler_trampoline();
    iVar5 = rxc_pipeline_start(prVar7,uVar8);
    if (iVar5 != 0) {
      return -1;
    }
    sStack_28.flags = '\b';
    sStack_28.length = 0;
    sas_client_session_send(client,&sStack_28);
    (client->session).state = '\x04';
    prVar4 = (client->session).sink_logic;
    (*prVar4->on_push)(prVar4,&(client->session).chunk);
  }
  else {
    if ((bVar1 & 0x10) != 0) {
      sas_transport_packet_err_decode((sas_transport_packet_err *)(header + 1));
      return header[1].seq;
    }
    if ((bVar1 & 1) == 0) {
      return 0x68;
    }
    (client->session).state = '\x05';
  }
  return 0;
}

Assistant:

int sas_client_session_state_machine(struct sas_client *client,
                                     struct sas_transport_packet_header *header,
                                     size_t count)
{

    /* Validate packet */
    if (header->seq < client->session.ack) {
        /* At this point we are receiving a packet we have already ack'ed.
         * Thus, we drop the packet */
        sas_log(LOG_DEBUG "Dropping packet\n");
        return 0;
    } else if (header->seq > client->session.ack) {
        /* The packet is out-of-order. In the future, we could reorder them,
         * for now, we just process it */
        sas_log(LOG_DEBUG "Out-of-order packet\n");
    }

    /* Update send window */
    client->session.send_window = header->window;

    /* Ack this packet */
    client->session.ack = header->seq + (header->length > 0 ? header->length : 1);

    /* Forget the session on reset */
    if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_RST)) {
        int err = ECONNRESET;

        if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_ERR)) {
            /* An error occurred */
            struct sas_transport_packet_err *packet = (void *) &header[1];
            sas_transport_packet_err_decode(packet);
            err = packet->err;
        } else if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_FIN)) {
            /* Stream finished successfully */
            err = 0;
            client->session.state = SAS_TRANSPORT_STATE_FINISHED;
        }

        return err;
    }

    switch (client->session.state) {
        case SAS_TRANSPORT_STATE_SYN_SENT: {
            struct sas_transport_packet_cfg_ack *cfg = (void *) &header[1];
            sas_transport_packet_cfg_ack_decode(cfg);

            client->session.chunk.dealloc = chunk_dealloc;
            client->session.chunk.sample_rate = cfg->sample_rate;
            client->session.chunk.sample_size = cfg->sample_size;
            client->session.chunk.channels = cfg->channels;
            client->session.chunk.codec = cfg->codec;
            client->session.chunk.size = header->length - sizeof(struct sas_transport_packet_cfg_ack);
            client->session.chunk.buffer = (void *) &cfg[1];

            sas_log(LOG_INFO "%d %d %d\n", cfg->sample_rate, cfg->sample_size, cfg->channels);

            /* Setup the streaming pipeline */
            int err;
            struct rxc_source *source = sas_client_session_source(client);
            client->session.pipeline = rxc_source_to(source, client->sink);

            if ((err = rxc_pipeline_start(client->session.pipeline, rxc_scheduler_trampoline())) != 0) {
                return -1;
            }

            sas_client_session_ack(client);
            client->session.state = SAS_TRANSPORT_STATE_ESTABLSH;

            /* Push configuration to sink */
            client->session.sink_logic->on_push(client->session.sink_logic, &client->session.chunk);
            break;
        }
        case SAS_TRANSPORT_STATE_ESTABLSH: {
            /* Push chunk to sink */
            client->session.chunk.size = header->length - sizeof(struct sas_transport_packet_cfg_ack);
            client->session.chunk.buffer = (void *) &header[1];
            client->session.sink_logic->on_push(client->session.sink_logic, &client->session.chunk);
            client->session.receive_window = 0;

            sas_client_session_ack(client);
            break;
        }
        default:
            sas_log(LOG_WARN "Unexpected state %d in state machine\n", client->session.state);
    }

    return 0;
}